

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3DeleteColumnNames(sqlite3 *db,Table *pTable)

{
  int iVar1;
  Column *pCVar2;
  
  pCVar2 = pTable->aCol;
  if (pCVar2 != (Column *)0x0) {
    if (0 < pTable->nCol) {
      iVar1 = 0;
      do {
        if (pCVar2->zName != (char *)0x0) {
          sqlite3DbFreeNN(db,pCVar2->zName);
        }
        if (pCVar2->pDflt != (Expr *)0x0) {
          sqlite3ExprDeleteNN(db,pCVar2->pDflt);
        }
        if (pCVar2->zColl != (char *)0x0) {
          sqlite3DbFreeNN(db,pCVar2->zColl);
        }
        iVar1 = iVar1 + 1;
        pCVar2 = pCVar2 + 1;
      } while (iVar1 < pTable->nCol);
    }
    if (pTable->aCol != (Column *)0x0) {
      sqlite3DbFreeNN(db,pTable->aCol);
      return;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DeleteColumnNames(sqlite3 *db, Table *pTable){
  int i;
  Column *pCol;
  assert( pTable!=0 );
  if( (pCol = pTable->aCol)!=0 ){
    for(i=0; i<pTable->nCol; i++, pCol++){
      sqlite3DbFree(db, pCol->zName);
      sqlite3ExprDelete(db, pCol->pDflt);
      sqlite3DbFree(db, pCol->zColl);
    }
    sqlite3DbFree(db, pTable->aCol);
  }
}